

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

string * __thiscall
runtime::VirtualMachine::variableToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,Variable var,bool panic)

{
  __buckets_ptr pp_Var1;
  bool bVar2;
  uint uVar3;
  anon_union_8_6_52c89740_for_Variable_1 aVar4;
  anon_union_8_6_52c89740_for_Variable_1 aVar5;
  int iVar6;
  uint __len;
  int iVar7;
  anon_union_8_6_52c89740_for_Variable_1 __val;
  string local_48;
  
  aVar4 = var.field_1;
  switch(var.type) {
  case Undefined:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    iVar6 = 0x122788;
    iVar7 = 0x122791;
    break;
  case Integer:
    __val.integerValue = -aVar4.integerValue;
    if (0 < aVar4.integerValue) {
      __val.integerValue = aVar4.integerValue;
    }
    __len = 1;
    if ((Object *)0x9 < __val.objectValue) {
      aVar5 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (aVar5.objectValue < (Object *)0x64) {
          __len = __len - 2;
          goto LAB_00118033;
        }
        if (aVar5.objectValue < (Object *)0x3e8) {
          __len = __len - 1;
          goto LAB_00118033;
        }
        if (aVar5.objectValue < (Object *)0x2710) goto LAB_00118033;
        bVar2 = (Object *)0x1869f < aVar5.objectValue;
        aVar5.integerValue = aVar5.integerValue / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_00118033:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (var.field_1._7_1_ >> 7));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -(aVar4.integerValue >> 0x3f),__len,
               __val.integerValue);
    return __return_storage_ptr__;
  case Boolean:
    iVar6 = 0x122782;
    if (((undefined1  [16])var & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar6 = 0x12277d;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    iVar7 = (var.field_1._0_4_ & 1 ^ 5) + iVar6;
    break;
  case Float:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",aVar4.integerValue);
    return __return_storage_ptr__;
  case String:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pp_Var1 = ((aVar4.objectValue)->properties)._M_h._M_buckets;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pp_Var1,
               ((aVar4.objectValue)->properties)._M_h._M_bucket_count + (long)pp_Var1);
    return __return_storage_ptr__;
  case Object:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    iVar6 = 0x123056;
    iVar7 = 0x12305e;
    break;
  case Function:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    iVar6 = 0x12304b;
    iVar7 = 0x123055;
    break;
  default:
    if (panic) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unknown varible type at variableToString","");
      VirtualMachine::panic(this,&local_48);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    iVar6 = 0x123088;
    iVar7 = 0x12308f;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,iVar6,iVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string VirtualMachine::variableToString(Variable var, bool panic) {
  switch (var.type) {
    case VariableType::Integer: {
      return std::to_string(var.integerValue);
    }
    case VariableType::Float: {
      return std::to_string(var.doubleValue);
    }
    case VariableType::Function: {
      return "<function>";
    }
    case VariableType::Object: {
      return "<object>";
    }
    case VariableType::String: {
      return *var.stringValue;
    }
    case VariableType::Undefined: {
      return "undefined";
    }
    case VariableType::Boolean: {
      return var.boolValue ? "true" : "false";
    }
    default: {
      if (panic) {
        this->panic("Unknown varible type at variableToString");
      } else {
        return "UKNOWN!";
      }
    }
  }
}